

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O0

EVaction old_EVassoc_terminal_action
                   (CManager cm,EVstone stone,CMFormatList format_list,EVSimpleHandlerFunc handler,
                   void *client_data)

{
  int iVar1;
  EVaction EVar2;
  FMStructDescList format_list_00;
  CManager_conflict in_RCX;
  long in_RDX;
  undefined8 in_R8;
  int i;
  int count;
  FMStructDescList structs;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 uVar3;
  int iVar4;
  int pointer_size;
  
  pointer_size = 0;
  while( true ) {
    uVar3 = false;
    if (in_RDX != 0) {
      uVar3 = *(long *)(in_RDX + (long)pointer_size * 0x10) != 0;
    }
    if ((bool)uVar3 == false) break;
    pointer_size = pointer_size + 1;
  }
  format_list_00 = (FMStructDescList)INT_CMmalloc((ulong)in_stack_ffffffffffffffc0);
  for (iVar4 = 0; iVar4 < pointer_size; iVar4 = iVar4 + 1) {
    format_list_00[iVar4].format_name = *(char **)(in_RDX + (long)iVar4 * 0x10);
    format_list_00[iVar4].field_list = *(FMFieldList *)(in_RDX + (long)iVar4 * 0x10 + 8);
    iVar1 = struct_size_field_list((FMFieldList)format_list_00,pointer_size);
    format_list_00[iVar4].struct_size = iVar1;
    format_list_00[iVar4].opt_info = (FMOptInfo *)0x0;
  }
  format_list_00[pointer_size].format_name = (char *)0x0;
  format_list_00[pointer_size].field_list = (FMFieldList)0x0;
  EVar2 = EVassoc_terminal_action
                    (in_RCX,(EVstone)((ulong)in_R8 >> 0x20),format_list_00,
                     (EVSimpleHandlerFunc)CONCAT44(pointer_size,iVar4),
                     (void *)CONCAT17(uVar3,in_stack_ffffffffffffffc0));
  return EVar2;
}

Assistant:

extern EVaction
old_EVassoc_terminal_action(CManager cm, EVstone stone, CMFormatList format_list, 
			EVSimpleHandlerFunc handler, void* client_data)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVassoc_terminal_action(cm, stone, structs, handler, client_data);
}